

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionBeamData.cpp
# Opt level: O0

void __thiscall
DIS::ElectromagneticEmissionBeamData::ElectromagneticEmissionBeamData
          (ElectromagneticEmissionBeamData *this)

{
  ElectromagneticEmissionBeamData *this_local;
  
  this->_vptr_ElectromagneticEmissionBeamData =
       (_func_int **)&PTR__ElectromagneticEmissionBeamData_00271b80;
  this->_beamDataLength = '\0';
  this->_beamIDNumber = '\0';
  this->_beamParameterIndex = 0;
  FundamentalParameterData::FundamentalParameterData(&this->_fundamentalParameterData);
  this->_beamFunction = '\0';
  this->_numberOfTrackJamTargets = '\0';
  this->_highDensityTrackJam = '\0';
  this->_pad4 = '\0';
  this->_jammingModeSequence = 0;
  std::vector<DIS::TrackJamTarget,_std::allocator<DIS::TrackJamTarget>_>::vector
            (&this->_trackJamTargets);
  return;
}

Assistant:

ElectromagneticEmissionBeamData::ElectromagneticEmissionBeamData():
   _beamDataLength(0), 
   _beamIDNumber(0), 
   _beamParameterIndex(0), 
   _fundamentalParameterData(), 
   _beamFunction(0), 
   _numberOfTrackJamTargets(0), 
   _highDensityTrackJam(0), 
   _pad4(0), 
   _jammingModeSequence(0)
{
}